

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaValidateStream
              (xmlSchemaValidCtxtPtr ctxt,xmlParserInputBufferPtr input,xmlCharEncoding enc,
              xmlSAXHandler *sax,void *user_data)

{
  int iVar1;
  int iVar2;
  xmlParserCtxtPtr ctxt_00;
  xmlParserInputPtr value;
  
  iVar2 = -1;
  if (input != (xmlParserInputBufferPtr)0x0 && ctxt != (xmlSchemaValidCtxtPtr)0x0) {
    if (sax == (xmlSAXHandler *)0x0) {
      ctxt_00 = xmlNewParserCtxt();
      if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
        return -1;
      }
      (*xmlFree)(ctxt_00->sax);
      ctxt_00->sax = (_xmlSAXHandler *)0x0;
    }
    else {
      ctxt_00 = xmlNewSAXParserCtxt(sax,user_data);
      if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
        return -1;
      }
    }
    value = xmlNewIOInputStream(ctxt_00,input,enc);
    iVar2 = -1;
    if (value != (xmlParserInputPtr)0x0) {
      iVar1 = xmlCtxtPushInput(ctxt_00,value);
      if (iVar1 < 0) {
        xmlFreeInputStream(value);
      }
      else {
        ctxt->enc = enc;
        iVar2 = xmlSchemaValidateStreamInternal(ctxt,ctxt_00);
      }
    }
    xmlFreeParserCtxt(ctxt_00);
  }
  return iVar2;
}

Assistant:

int
xmlSchemaValidateStream(xmlSchemaValidCtxtPtr ctxt,
                        xmlParserInputBufferPtr input, xmlCharEncoding enc,
                        const xmlSAXHandler *sax, void *user_data)
{
    xmlParserCtxtPtr pctxt = NULL;
    xmlParserInputPtr inputStream = NULL;
    int ret;

    if ((ctxt == NULL) || (input == NULL))
        return (-1);

    /*
     * prepare the parser
     */
    if (sax != NULL) {
        pctxt = xmlNewSAXParserCtxt(sax, user_data);
        if (pctxt == NULL)
            return (-1);
    } else {
        pctxt = xmlNewParserCtxt();
        if (pctxt == NULL)
            return (-1);
        /* We really want pctxt->sax to be NULL here. */
        xmlFree(pctxt->sax);
        pctxt->sax = NULL;
    }
#if 0
    if (options)
        xmlCtxtUseOptions(pctxt, options);
#endif

    inputStream = xmlNewIOInputStream(pctxt, input, enc);;
    if (inputStream == NULL) {
        ret = -1;
	goto done;
    }
    if (xmlCtxtPushInput(pctxt, inputStream) < 0) {
        xmlFreeInputStream(inputStream);
        ret = -1;
        goto done;
    }

    ctxt->enc = enc;

    ret = xmlSchemaValidateStreamInternal(ctxt, pctxt);

done:
    /* cleanup */
    if (pctxt != NULL) {
	xmlFreeParserCtxt(pctxt);
    }
    return (ret);
}